

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall despot::util::tinyxml::TiXmlNode::Clear(TiXmlNode *this)

{
  TiXmlNode *pTVar1;
  TiXmlBase *pTVar2;
  
  pTVar1 = this->firstChild;
  while (pTVar1 != (TiXmlNode *)0x0) {
    pTVar2 = &pTVar1->super_TiXmlBase;
    pTVar1 = pTVar1->next;
    (*pTVar2->_vptr_TiXmlBase[1])();
  }
  this->firstChild = (TiXmlNode *)0x0;
  this->lastChild = (TiXmlNode *)0x0;
  return;
}

Assistant:

void TiXmlNode::Clear() {
	TiXmlNode* node = firstChild;
	TiXmlNode* temp = 0;

	while (node) {
		temp = node;
		node = node->next;
		delete temp;
	}

	firstChild = 0;
	lastChild = 0;
}